

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_on_invalid_frame_recv_callback
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code)

{
  int iVar1;
  int lib_error_code_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (((session->callbacks).on_invalid_frame_recv_callback ==
       (nghttp2_on_invalid_frame_recv_callback)0x0) ||
     (iVar1 = (*(session->callbacks).on_invalid_frame_recv_callback)
                        (session,frame,lib_error_code,session->user_data), iVar1 == 0)) {
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int session_call_on_invalid_frame_recv_callback(nghttp2_session *session,
                                                       nghttp2_frame *frame,
                                                       int lib_error_code) {
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
            session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}